

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O3

int __thiscall glcts::CubeMapArrayDataStorage::init(CubeMapArrayDataStorage *this,EVP_PKEY_CTX *ctx)

{
  GLubyte *__s;
  void *pvVar1;
  GLuint in_ECX;
  GLuint in_EDX;
  uint in_R8D;
  ulong __n;
  
  if (this->m_data_array != (GLubyte *)0x0) {
    operator_delete__(this->m_data_array);
    this->m_data_array = (GLubyte *)0x0;
  }
  this->m_width = (GLuint)ctx;
  this->m_height = in_EDX;
  this->m_depth = in_ECX;
  __n = (ulong)((GLuint)ctx * in_EDX * in_ECX * 4);
  __s = (GLubyte *)operator_new__(__n);
  this->m_data_array = __s;
  pvVar1 = memset(__s,in_R8D & 0xff,__n);
  return (int)pvVar1;
}

Assistant:

void CubeMapArrayDataStorage::init(const glw::GLuint width, const glw::GLuint height, const glw::GLuint depth,
								   glw::GLubyte initial_value)
{
	deinit();

	m_width  = width;
	m_height = height;
	m_depth  = depth;

	m_data_array = new glw::GLubyte[getArraySize()];

	memset(m_data_array, initial_value, getArraySize() * sizeof(glw::GLubyte));
}